

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
 __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::connectToIntroduced
          (ConnectionImpl *this,Reader contact,Builder completion)

{
  int iVar1;
  undefined8 uVar2;
  size_t __n;
  sockaddr *__addr;
  Connection *extraout_RDX;
  long in_RSI;
  bool bVar3;
  ArrayPtr<const_char> AVar4;
  Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  MVar5;
  DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> local_90;
  StructReader local_60;
  
  if (contact._reader.pointerCount < 2) {
    iVar1 = 0x7fffffff;
    local_90.left.super_StringPtr.content.size_ = 0;
    local_90.right = (StringPtr *)0x0;
    local_90.left.super_StringPtr.content.ptr = (char *)0x0;
  }
  else {
    local_90.right = (StringPtr *)(contact._reader.pointers + 1);
    local_90.left.super_StringPtr.content.size_ = (size_t)contact._reader.capTable;
    local_90.left.super_StringPtr.content.ptr = (char *)contact._reader.segment;
    iVar1 = contact._reader.nestingLimit;
  }
  local_90.op.content.ptr = (char *)CONCAT44(local_90.op.content.ptr._4_4_,iVar1);
  bVar3 = false;
  AVar4 = (ArrayPtr<const_char>)
          PointerReader::getBlob<capnp::Text>((PointerReader *)&local_90,(void *)0x0,0);
  __n = AVar4.size_;
  if (__n == *(size_t *)(in_RSI + 0xc0)) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(AVar4.ptr,(((StringPtr *)(in_RSI + 0xb8))->content).ptr,__n);
      bVar3 = iVar1 == 0;
    }
  }
  local_90.op.content.ptr = " == ";
  local_90.op.content.size_ = 5;
  local_90.result = bVar3;
  if ((bVar3 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_90.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar4;
    local_90.right = (StringPtr *)(in_RSI + 0xb8);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"contact.getSentBy() == partnerName\", _kjCondition",
               (char (*) [52])"failed: expected contact.getSentBy() == partnerName",&local_90);
  }
  if (contact._reader.dataSize < 0x40) {
    uVar2 = 0;
  }
  else {
    uVar2 = *contact._reader.data;
  }
  *(undefined8 *)completion._builder.data = uVar2;
  uVar2 = *(undefined8 *)(in_RSI + 0x20);
  if (contact._reader.pointerCount == 0) {
    contact._reader.nestingLimit = 0x7fffffff;
    contact._reader.capTable = (CapTableReader *)0x0;
    contact._reader.pointers = (WirePointer *)0x0;
    contact._reader.segment = (SegmentReader *)0x0;
  }
  local_90.left.super_StringPtr.content.size_ = (size_t)contact._reader.capTable;
  local_90.left.super_StringPtr.content.ptr = (char *)contact._reader.segment;
  local_90.op.content.ptr =
       (char *)CONCAT44(local_90.op.content.ptr._4_4_,contact._reader.nestingLimit);
  local_90.right = (StringPtr *)contact._reader.pointers;
  PointerReader::getStruct(&local_60,(PointerReader *)&local_90,(word *)0x0);
  connect((TestVat *)this,(int)uVar2,__addr,(socklen_t)contact._reader.capTable);
  MVar5.ptr.ptr = extraout_RDX;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
          )MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connectToIntroduced(
        test::TestThirdPartyToContact::Reader contact,
        test::TestThirdPartyCompletion::Builder completion) override {
      KJ_EXPECT(contact.getSentBy() == partnerName);
      completion.setToken(contact.getToken());
      return vat.connect(contact.getPath());
    }